

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cmp.cpp
# Opt level: O2

bool __thiscall CmdCmp::Execute(CmdCmp *this)

{
  char cVar1;
  FileType FVar2;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  _Self __tmp;
  string *psVar6;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  char t2;
  char t1;
  string fileName2;
  string fileName1;
  ifstream file2;
  byte abStack_420 [488];
  ifstream file1;
  uint auStack_218 [122];
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"cmp: invalid option -- \'");
    poVar4 = std::operator<<(poVar4,(string *)
                                    ((this->super_Command).option.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node.super__List_node_base._M_next + 1));
    poVar4 = std::operator<<(poVar4,"\'");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar8 = "Try \'cmp -- help\' for more information.";
LAB_0010ac99:
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar4);
    return false;
  }
  if ((this->super_Command).parameter.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size < 2) {
    pcVar8 = "error";
    goto LAB_0010ac99;
  }
  fileName1._M_dataplus._M_p = (pointer)&fileName1.field_2;
  fileName1._M_string_length = 0;
  fileName2._M_dataplus._M_p = (pointer)&fileName2.field_2;
  fileName2._M_string_length = 0;
  fileName1.field_2._M_local_buf[0] = '\0';
  fileName2.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&fileName1);
  std::__cxx11::string::_M_assign((string *)&fileName2);
  psVar6 = &fileName1;
  FVar2 = DirUtils::GetFileType(psVar6);
  if (FVar2 == DU_DIRECTORY) {
    poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
    psVar6 = &fileName1;
  }
  else {
    FVar2 = DirUtils::GetFileType(&fileName2);
    if (FVar2 != DU_DIRECTORY) {
      std::ifstream::ifstream(&file1,fileName1._M_dataplus._M_p,_S_bin);
      std::ifstream::ifstream(&file2,fileName2._M_dataplus._M_p,_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
LAB_0010aead:
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,": No such file or directory");
        std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010aecf:
        bVar9 = false;
      }
      else {
        cVar1 = std::__basic_file<char>::is_open();
        if (cVar1 == '\0') {
          poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
          psVar6 = &fileName2;
          goto LAB_0010aead;
        }
        uVar3 = *(uint *)((long)auStack_218 + *(long *)(_file1 + -0x18));
        iVar7 = 1;
        iVar5 = 1;
        while( true ) {
          bVar9 = true;
          if (((uVar3 & 2) != 0) || ((abStack_420[*(long *)(_file2 + -0x18)] & 2) != 0))
          goto LAB_0010aed2;
          std::istream::read((char *)&file1,(long)&t1);
          std::istream::read((char *)&file2,(long)&t2);
          uVar3 = *(uint *)((long)auStack_218 + *(long *)(_file1 + -0x18));
          if ((uVar3 & 5) != 0) break;
          if ((abStack_420[*(long *)(_file2 + -0x18)] & 5) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"cmp: EOF on ");
            psVar6 = &fileName2;
            goto LAB_0010af3b;
          }
          if (t1 != t2) {
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)&fileName1);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = std::operator<<(poVar4,(string *)&fileName2);
            std::operator<<(poVar4," differ: ");
            poVar4 = std::operator<<((ostream *)&std::cout,"byte ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
            std::operator<<(poVar4,", ");
            poVar4 = std::operator<<((ostream *)&std::cout,"line ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
            goto LAB_0010afc9;
          }
          iVar5 = iVar5 + (uint)(t1 == '\n');
          iVar7 = iVar7 + 1;
        }
        if ((abStack_420[*(long *)(_file2 + -0x18)] & 5) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"cmp: EOF on ");
          psVar6 = &fileName1;
LAB_0010af3b:
          poVar4 = std::operator<<(poVar4,(string *)psVar6);
LAB_0010afc9:
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_0010aecf;
        }
      }
LAB_0010aed2:
      std::ifstream::~ifstream(&file2);
      std::ifstream::~ifstream(&file1);
      goto LAB_0010aee9;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
    psVar6 = &fileName2;
  }
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,": Is a directory");
  std::endl<char,std::char_traits<char>>(poVar4);
  bVar9 = false;
LAB_0010aee9:
  std::__cxx11::string::~string((string *)&fileName2);
  std::__cxx11::string::~string((string *)&fileName1);
  return bVar9;
}

Assistant:

bool CmdCmp::Execute(){
	if(option.size() != 0){	
		cout << "cmp: invalid option -- '" << option.front() << "'" << endl;
		cout << "Try 'cmp -- help' for more information." << endl;
		return false;
	}
	if(parameter.size() < 2){
		cout << "error" << endl;
		return false;
	}
	auto i = parameter.begin();
	string fileName1, fileName2;
	fileName1 = (*i);
	i++;
	fileName2 = (*i);

	if(GetFileType(fileName1) == DU_DIRECTORY){
		cout << "cmp: " << fileName1 << ": Is a directory" << endl;
		return false;
	}
	if(GetFileType(fileName2) == DU_DIRECTORY){
		cout << "cmp: " << fileName2 << ": Is a directory" << endl;
		return false;
	}
	/* input file */
	ifstream file1(fileName1.c_str(), ios::binary),
		file2(fileName2.c_str(), ios::binary);
	if(!file1.is_open()){
		cout << "cmp: " << fileName1 << ": No such file or directory" << endl;
		return false;
	}
	if(!file2.is_open()){
		cout << "cmp: " << fileName2 << ": No such file or directory" << endl;
		return false;
	}
	/* comparing */
	char t1, t2;
	int cntLine = 1, cntByte = 0;

	while(!file1.eof() && !file2.eof()){
		cntByte++;
		file1.read(&t1, sizeof(t1));
		file2.read(&t2, sizeof(t2));
		if(file1.fail() && file2.fail())return true;
		if(file1.fail()){
			cout << "cmp: EOF on " << fileName1 << endl;
			return false;
		}
		if(file2.fail()){
			cout << "cmp: EOF on " << fileName2 << endl;
			return false;
		}
		if(t1 != t2){
			cout << fileName1 << ' ' << fileName2 << " differ: ";
			cout << "byte " << cntByte << ", ";
			cout << "line " << cntLine << endl;
			return 0;
		}
		if(t1 == '\n')cntLine++;
	}

	return true;
}